

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int base64_decode_quartet_using_maps(base64_maps_t *maps,char *dest,char *src)

{
  int iVar1;
  int *piVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  
  cVar4 = maps->decode_map[(byte)*src];
  if (cVar4 == -1) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    cVar4 = -1;
  }
  cVar5 = maps->decode_map[(byte)src[1]];
  if (cVar5 == -1) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    cVar5 = -1;
  }
  cVar6 = maps->decode_map[(byte)src[2]];
  if (cVar6 == -1) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    cVar6 = -1;
  }
  bVar3 = maps->decode_map[(byte)src[3]];
  if (bVar3 == 0xff) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    bVar3 = 0xff;
  }
  iVar1 = -1;
  if ((((cVar4 != -1) && (cVar5 != -1)) && (cVar6 != -1)) && (bVar3 != 0xff)) {
    *dest = cVar5 >> 4 | cVar4 << 2;
    dest[1] = cVar6 >> 2 | cVar5 << 4;
    dest[2] = bVar3 | cVar6 << 6;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int base64_decode_quartet_using_maps(const base64_maps_t *maps, char dest[3],
				     const char src[4])
{
	signed char a;
	signed char b;
	signed char c;
	signed char d;

	a = sixbit_from_b64(maps, src[0]);
	b = sixbit_from_b64(maps, src[1]);
	c = sixbit_from_b64(maps, src[2]);
	d = sixbit_from_b64(maps, src[3]);

	if ((a == -1) || (b == -1) || (c == -1) || (d == -1)) {
		return -1;
	}

	dest[0] = (a << 2) | (b >> 4);
	dest[1] = ((b & 0xf) << 4) | (c >> 2);
	dest[2] = ((c & 0x3) << 6) | d;

	return 0;
}